

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<sophiaevent_output,_std::shared_ptr<sophiaevent_output>_> * __thiscall
pybind11::class_<sophiaevent_output,std::shared_ptr<sophiaevent_output>>::
def<int(sophiaevent_output::*)(int)const>
          (class_<sophiaevent_output,std::shared_ptr<sophiaevent_output>> *this,char *name_,
          offset_in_sophiaevent_output_to_subr *f)

{
  offset_in_sophiaevent_output_to_subr f_00;
  name *extra;
  handle obj;
  cpp_function key;
  is_method local_78;
  PyObject *local_70;
  handle local_68;
  object local_60;
  object local_58;
  object local_50;
  handle local_48;
  handle local_40;
  cpp_function cf;
  
  f_00 = *f;
  extra = (name *)f[1];
  local_58.super_handle.m_ptr = *(handle *)this;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_78.class_.m_ptr = (handle)(handle)name_;
  local_48.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_48.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_48.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)local_48.m_ptr;
  cpp_function::
  cpp_function<int,sophiaevent_output,int,pybind11::name,pybind11::is_method,pybind11::sibling>
            ((cpp_function *)&local_40,f_00,extra,&local_78,(sibling *)&local_58);
  object::~object((object *)&local_48);
  object::~object(&local_50);
  cpp_function::name(&cf);
  key = cf;
  obj.m_ptr = *(PyObject **)this;
  if ((object)cf.super_function.super_object.super_handle.m_ptr != (PyObject *)0x0) {
    *(long *)cf.super_function.super_object.super_handle.m_ptr =
         *(long *)cf.super_function.super_object.super_handle.m_ptr + 1;
  }
  local_68.m_ptr = (PyObject *)cf.super_function.super_object.super_handle.m_ptr;
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_60.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_70 = obj.m_ptr;
  object::~object(&local_58);
  detail::accessor_policies::obj_attr::set
            (obj,(handle)key.super_function.super_object.super_handle.m_ptr,local_40);
  object::~object(&local_60);
  object::~object((object *)&local_68);
  object::~object((object *)&cf);
  object::~object((object *)&local_40);
  return (class_<sophiaevent_output,_std::shared_ptr<sophiaevent_output>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }